

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

Expression * __thiscall
wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>::findBreakTarget
          (ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_> *this,Name name)

{
  Id IVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *pEVar4;
  Expression **ppEVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  Expression **ppEVar9;
  Expression **ppEVar10;
  
  sVar2 = (this->controlFlowStack).usedFixed;
  ppEVar3 = (this->controlFlowStack).flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar8 = (long)(this->controlFlowStack).flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3;
  if (lVar8 + sVar2 == 0) {
    __assert_fail("!controlFlowStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x180,
                  "Expression *wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>::findBreakTarget(Name) [SubType = NullFixer, VisitorType = wasm::SubtypingDiscoverer<NullFixer>]"
                 );
  }
  uVar7 = (ulong)(((int)sVar2 + (int)lVar8) - 1);
  ppEVar9 = ppEVar3 + (uVar7 - 10);
  ppEVar10 = (this->controlFlowStack).fixed._M_elems + uVar7;
  do {
    uVar6 = (uint)uVar7;
    ppEVar5 = ppEVar9;
    if (uVar6 < 10) {
      ppEVar5 = ppEVar10;
    }
    pEVar4 = *ppEVar5;
    IVar1 = pEVar4->_id;
    if (IVar1 < 0x34) {
      if (IVar1 != BlockId) {
        if (IVar1 == IfId) goto LAB_00a65056;
        if (IVar1 != LoopId) goto LAB_00a65067;
      }
      if ((char *)pEVar4[1].type.id == name.super_IString.str._M_str) {
        return pEVar4;
      }
    }
    else if (1 < IVar1 - 0x34) {
LAB_00a65067:
      __assert_fail("curr->template is<If>() || curr->template is<Try>() || curr->template is<TryTable>()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,399,
                    "Expression *wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>::findBreakTarget(Name) [SubType = NullFixer, VisitorType = wasm::SubtypingDiscoverer<NullFixer>]"
                   );
    }
LAB_00a65056:
    ppEVar9 = ppEVar9 + -1;
    ppEVar10 = ppEVar10 + -1;
    uVar7 = (ulong)(uVar6 - 1);
    if (uVar6 == 0) {
      return (Expression *)0x0;
    }
  } while( true );
}

Assistant:

Expression* findBreakTarget(Name name) {
    assert(!controlFlowStack.empty());
    Index i = controlFlowStack.size() - 1;
    while (true) {
      auto* curr = controlFlowStack[i];
      if (Block* block = curr->template dynCast<Block>()) {
        if (name == block->name) {
          return curr;
        }
      } else if (Loop* loop = curr->template dynCast<Loop>()) {
        if (name == loop->name) {
          return curr;
        }
      } else {
        // an if, try, or try_table, ignorable
        assert(curr->template is<If>() || curr->template is<Try>() ||
               curr->template is<TryTable>());
      }
      if (i == 0) {
        return nullptr;
      }
      i--;
    }
  }